

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O0

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::swap
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode1,
          BNode<ADS::NodeDistancePairClass_*> *pNode1Prev,
          BNode<ADS::NodeDistancePairClass_*> *pNode2,
          BNode<ADS::NodeDistancePairClass_*> *pNode2Prev)

{
  uint uVar1;
  BNode<ADS::NodeDistancePairClass_*> *pSibling;
  BNode<ADS::NodeDistancePairClass_*> *pBVar2;
  double in_XMM0_Qa;
  BNode<ADS::NodeDistancePairClass_*> *pTmp;
  BNode<ADS::NodeDistancePairClass_*> *pBStack_40;
  uint uiTmpDegree;
  BNode<ADS::NodeDistancePairClass_*> *pChild;
  BNode<ADS::NodeDistancePairClass_*> *pParent;
  BNode<ADS::NodeDistancePairClass_*> *pNode2Prev_local;
  BNode<ADS::NodeDistancePairClass_*> *pNode2_local;
  BNode<ADS::NodeDistancePairClass_*> *pNode1Prev_local;
  BNode<ADS::NodeDistancePairClass_*> *pNode1_local;
  BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this_local;
  
  if ((pNode1->pParent != pNode2) && (pNode2->pParent != pNode1)) {
    log(in_XMM0_Qa);
    exit(1);
  }
  pBStack_40 = pNode2;
  pChild = pNode1;
  if (pNode1->pParent == pNode2) {
    pBStack_40 = pNode1;
    pChild = pNode2;
  }
  updateParent(this,pBStack_40->pFirstChild,pChild);
  updateParent(this,(BNode<ADS::NodeDistancePairClass_*> *)
                    (pBStack_40->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling,pBStack_40)
  ;
  pBStack_40->pParent = pChild->pParent;
  pChild->pParent = pBStack_40;
  pChild->pFirstChild = pBStack_40->pFirstChild;
  pBStack_40->pFirstChild = pChild;
  if ((pBStack_40->pParent != (BNode<ADS::NodeDistancePairClass_*> *)0x0) &&
     (pBStack_40->pParent->pFirstChild == pChild)) {
    pBStack_40->pParent->pFirstChild = pBStack_40;
  }
  uVar1 = pNode1->uiDegree;
  pNode1->uiDegree = pNode2->uiDegree;
  pNode2->uiDegree = uVar1;
  pSibling = BNode<ADS::NodeDistancePairClass_*>::getSibling(pNode1);
  pBVar2 = BNode<ADS::NodeDistancePairClass_*>::getSibling(pNode2);
  if (pBVar2 == pNode2) {
    BNode<ADS::NodeDistancePairClass_*>::setSibling(pNode1,pNode1);
  }
  else {
    pBVar2 = BNode<ADS::NodeDistancePairClass_*>::getSibling(pNode2);
    BNode<ADS::NodeDistancePairClass_*>::setSibling(pNode1,pBVar2);
    (pNode2Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling =
         &pNode1->super_Node<ADS::NodeDistancePairClass_*>;
  }
  if (pSibling == pNode1) {
    BNode<ADS::NodeDistancePairClass_*>::setSibling(pNode2,pNode2);
  }
  else {
    BNode<ADS::NodeDistancePairClass_*>::setSibling(pNode2,pSibling);
    (pNode1Prev->super_Node<ADS::NodeDistancePairClass_*>).pRightSibling =
         &pNode2->super_Node<ADS::NodeDistancePairClass_*>;
  }
  return;
}

Assistant:

void BHeap<T, Comparator>::swap (BNode<T> *pNode1, BNode<T> *pNode1Prev,
                                     BNode<T> *pNode2, BNode<T> *pNode2Prev)
    {
        if ((pNode1->pParent != pNode2) && (pNode2->pParent != pNode1)) {
            log ("Error! Only parent/child nodes can be swapped\n");
            exit (1);
        }

        /* Update parent/child links */
        BNode<T> *pParent, *pChild;
        if (pNode1->pParent == pNode2) {
            pParent = pNode2;
            pChild = pNode1;
        }
        else {
            pParent = pNode1;
            pChild = pNode2;
        }

        updateParent (pChild->pFirstChild, pParent);
        updateParent (static_cast<BNode<T>*>(pChild->pRightSibling), pChild);

        pChild->pParent = pParent->pParent;
        pParent->pParent = pChild;
        pParent->pFirstChild = pChild->pFirstChild;
        pChild->pFirstChild = pParent;

        /* update new pChild's parent link to it*/
        if (pChild->pParent != NULL && pChild->pParent->pFirstChild == pParent)
            /* if pChild->pParent->pFirstChild points to one of previous
               pParent's siblings there is not need to update it, otherwise
               make it point to pChild */
            pChild->pParent->pFirstChild = pChild;
        
        unsigned int uiTmpDegree = pNode1->uiDegree;
        pNode1->uiDegree = pNode2->uiDegree;
        pNode2->uiDegree = uiTmpDegree;

       /* T elementTmp = pNode1->el;
        pNode1->el = pNode2->el;
        pNode2->el = elementTmp;*/

        /* Update sibling links */
        BNode<T> *pTmp = pNode1->getSibling();
        if (pNode2->getSibling() == pNode2) {
            pNode1->setSibling (pNode1);                
        }
        else {
            pNode1->setSibling (pNode2->getSibling());            
            pNode2Prev->pRightSibling = pNode1;
        }
        
        if (pTmp == pNode1) {
            pNode2->setSibling (pNode2);
        }
        else {
            pNode2->setSibling (pTmp);
            pNode1Prev->pRightSibling = pNode2;
        }
    }